

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aac.cpp
# Opt level: O0

void __thiscall AACCodec::buildADTSHeader(AACCodec *this,uint8_t *buffer,uint frameSize)

{
  byte local_42;
  byte local_41;
  undefined1 local_40 [6];
  uint8_t i_1;
  uint8_t i;
  BitStreamWriter writer;
  uint frameSize_local;
  uint8_t *buffer_local;
  AACCodec *this_local;
  
  writer.m_bitWrited = frameSize;
  BitStreamWriter::BitStreamWriter((BitStreamWriter *)local_40);
  BitStreamWriter::setBuffer((BitStreamWriter *)local_40,buffer,buffer + 7);
  BitStreamWriter::putBits((BitStreamWriter *)local_40,0xc,0xfff);
  BitStreamWriter::putBit((BitStreamWriter *)local_40,this->m_id);
  BitStreamWriter::putBits((BitStreamWriter *)local_40,2,this->m_layer);
  BitStreamWriter::putBit((BitStreamWriter *)local_40,1);
  BitStreamWriter::putBits((BitStreamWriter *)local_40,2,(uint)this->m_profile);
  this->m_sample_rates_index = '\0';
  for (local_41 = 0; local_41 < 0x10; local_41 = local_41 + 1) {
    if (aac_sample_rates[local_41] == this->m_sample_rate) {
      this->m_sample_rates_index = local_41;
      break;
    }
  }
  BitStreamWriter::putBits((BitStreamWriter *)local_40,4,(uint)this->m_sample_rates_index);
  BitStreamWriter::putBit((BitStreamWriter *)local_40,0);
  this->m_channels_index = '\0';
  local_42 = 0;
  do {
    if (7 < local_42) {
LAB_002703d5:
      BitStreamWriter::putBits((BitStreamWriter *)local_40,3,(uint)this->m_channels_index);
      BitStreamWriter::putBit((BitStreamWriter *)local_40,0);
      BitStreamWriter::putBit((BitStreamWriter *)local_40,0);
      BitStreamWriter::putBit((BitStreamWriter *)local_40,0);
      BitStreamWriter::putBit((BitStreamWriter *)local_40,0);
      BitStreamWriter::putBits((BitStreamWriter *)local_40,0xd,writer.m_bitWrited);
      BitStreamWriter::putBits((BitStreamWriter *)local_40,0xb,0x7ff);
      BitStreamWriter::putBits((BitStreamWriter *)local_40,2,(uint)this->m_rdb);
      BitStreamWriter::flushBits((BitStreamWriter *)local_40);
      return;
    }
    if (""[local_42] == this->m_channels) {
      this->m_channels_index = local_42;
      goto LAB_002703d5;
    }
    local_42 = local_42 + 1;
  } while( true );
}

Assistant:

void AACCodec::buildADTSHeader(uint8_t* buffer, const unsigned frameSize)
{
    BitStreamWriter writer{};
    writer.setBuffer(buffer, buffer + AAC_HEADER_LEN);
    writer.putBits(12, 0xfff);
    writer.putBit(m_id);
    writer.putBits(2, m_layer);
    writer.putBit(1);  // protection_absent
    writer.putBits(2, m_profile);
    m_sample_rates_index = 0;
    for (uint8_t i = 0; i < 16; i++)
        if (aac_sample_rates[i] == m_sample_rate)
        {
            m_sample_rates_index = i;
            break;
        }
    writer.putBits(4, m_sample_rates_index);
    writer.putBit(0); /* private_bit */
    m_channels_index = 0;
    for (uint8_t i = 0; i < 8; i++)
        if (aac_channels[i] == m_channels)
        {
            m_channels_index = i;
            break;
        }
    writer.putBits(3, m_channels_index);

    writer.putBit(0); /* original/copy */
    writer.putBit(0); /* home */

    /* adts_variable_header */
    writer.putBit(0); /* copyright_identification_bit */
    writer.putBit(0); /* copyright_identification_start */

    writer.putBits(13, frameSize);  // /* aac_frame_length */
    writer.putBits(11, 2047);       // /* adts_buffer_fullness */
    writer.putBits(2, m_rdb);       /* number_of_raw_data_blocks_in_frame */
    writer.flushBits();
}